

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsViewPrivate::mapRectToScene(QGraphicsViewPrivate *this,QRect *rect)

{
  QRectF *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRectF scrolled;
  QGraphicsViewPrivate *r;
  undefined8 local_88;
  undefined8 uVar1;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = in_RDI;
  if ((*(uint *)&in_RSI[0x18].xp >> 5 & 1) != 0) {
    updateScroll(in_RDI);
  }
  uVar1 = 0xffffffffffffffff;
  QRect::translated((QRect *)0xffffffffffffffff,(int)((ulong)local_88 >> 0x20),(int)local_88);
  QRectF::QRectF(in_RSI,(QRect *)r);
  if ((*(uint *)&in_RSI[0x18].xp >> 4 & 1) == 0) {
    QTransform::inverted(local_58);
    QTransform::mapRect((QRectF *)in_RDI);
  }
  else {
    *(undefined8 *)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = uVar1;
    *(undefined8 *)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8
         = 0xffffffffffffffff;
    *(undefined8 *)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10
         = 0xffffffffffffffff;
    *(undefined8 *)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x18
         = 0xffffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRectF *)r;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectToScene(const QRect &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    QRectF scrolled = QRectF(rect.translated(scrollX, scrollY));
    return identityMatrix ? scrolled : matrix.inverted().mapRect(scrolled);
}